

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O3

BigUnsigned<4> *
absl::lts_20250127::strings_internal::BigUnsigned<4>::FiveToTheNth
          (BigUnsigned<4> *__return_storage_ptr__,int n)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  int __n2;
  
  uVar3 = (ulong)(uint)n;
  BigUnsigned(__return_storage_ptr__,1);
  if (0x1a < n) {
    bVar1 = true;
    do {
      iVar2 = (int)(uVar3 * 0x2f684bdb >> 0x20);
      uVar4 = ((uint)((int)uVar3 - iVar2) >> 1) + iVar2 >> 4;
      if (0x13 < uVar4) {
        uVar4 = 0x14;
      }
      if (bVar1) {
        memcpy(__return_storage_ptr__->words_,
               strings_internal::(anonymous_namespace)::kLargePowersOfFive +
               (ulong)((uVar4 - 1) * uVar4) * 4,(ulong)(uVar4 * 8));
        __return_storage_ptr__->size_ = uVar4 * 2;
      }
      else {
        MultiplyBy(__return_storage_ptr__,uVar4 * 2,
                   (uint32_t *)
                   (strings_internal::(anonymous_namespace)::kLargePowersOfFive +
                   (ulong)((uVar4 - 1) * uVar4) * 4));
      }
      n = (int)uVar3 + uVar4 * -0x1b;
      uVar3 = (ulong)(uint)n;
      bVar1 = false;
    } while (0x1a < n);
  }
  MultiplyByFiveToTheNth(__return_storage_ptr__,n);
  return __return_storage_ptr__;
}

Assistant:

BigUnsigned<max_words> BigUnsigned<max_words>::FiveToTheNth(
    int n) {
  BigUnsigned answer(1u);

  // Seed from the table of large powers, if possible.
  bool first_pass = true;
  while (n >= kLargePowerOfFiveStep) {
    int big_power =
        std::min(n / kLargePowerOfFiveStep, kLargestPowerOfFiveIndex);
    if (first_pass) {
      // just copy, rather than multiplying by 1
      std::copy_n(LargePowerOfFiveData(big_power),
                  LargePowerOfFiveSize(big_power), answer.words_);
      answer.size_ = LargePowerOfFiveSize(big_power);
      first_pass = false;
    } else {
      answer.MultiplyBy(LargePowerOfFiveSize(big_power),
                        LargePowerOfFiveData(big_power));
    }
    n -= kLargePowerOfFiveStep * big_power;
  }
  answer.MultiplyByFiveToTheNth(n);
  return answer;
}